

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOBoard.cpp
# Opt level: O2

void __thiscall IOBoard::writeBoardIntoFile(IOBoard *this,Board *board,string *fileName)

{
  pointer puVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar2;
  ostream *poVar3;
  pointer puVar4;
  ofstream ofs;
  byte abStack_208 [480];
  
  std::ofstream::ofstream(&ofs,(string *)fileName,_S_out);
  if ((abStack_208[*(long *)(_ofs + -0x18)] & 5) == 0) {
    pvVar2 = Board::getBoardValues(board);
    puVar1 = (pvVar2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar4 = (pvVar2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&ofs);
      std::operator<<(poVar3,',');
    }
    Board::getSizeInt(board);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&ofs);
    std::operator<<(poVar3,'\n');
    std::ofstream::close();
  }
  std::ofstream::~ofstream(&ofs);
  return;
}

Assistant:

void IOBoard::writeBoardIntoFile( const Board& board, const std::string& fileName )
{
    std::ofstream ofs( fileName );
    if ( !ofs )
    {
        return;
    }

    const auto& values = board.getBoardValues();
    for ( uint value : values )
    {
        ofs << value << ',';
    }
    ofs << board.getSizeInt() << '\n';
    ofs.close();
}